

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

ssize_t Curl_bufq_slurp(bufq *q,Curl_bufq_reader *reader,void *reader_ctx,CURLcode *err)

{
  ssize_t sVar1;
  CURLcode *err_local;
  void *reader_ctx_local;
  Curl_bufq_reader *reader_local;
  bufq *q_local;
  
  sVar1 = bufq_slurpn(q,0,reader,reader_ctx,err);
  return sVar1;
}

Assistant:

ssize_t Curl_bufq_slurp(struct bufq *q, Curl_bufq_reader *reader,
                        void *reader_ctx, CURLcode *err)
{
  return bufq_slurpn(q, 0, reader, reader_ctx, err);
}